

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

uint32_t * __thiscall
llvm::DataExtractor::getU32(DataExtractor *this,uint64_t *offset_ptr,uint32_t *dst,uint32_t count)

{
  uint8_t uVar1;
  char *Data;
  uint *puVar2;
  uint32_t count_local;
  uint32_t *dst_local;
  uint64_t *offset_ptr_local;
  DataExtractor *this_local;
  
  uVar1 = this->IsLittleEndian;
  Data = StringRef::data(&this->Data);
  puVar2 = getUs<unsigned_int>(offset_ptr,dst,count,this,uVar1 != '\0',Data,(Error *)0x0);
  return puVar2;
}

Assistant:

uint32_t *DataExtractor::getU32(uint64_t *offset_ptr, uint32_t *dst,
                                uint32_t count) const {
  return getUs<uint32_t>(offset_ptr, dst, count, this, IsLittleEndian,
                         Data.data(), nullptr);
}